

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O1

void embree::sse42::
     BVHNIntersector1<4,_1048576,_false,_embree::sse42::ArrayIntersector1<embree::sse42::QuadMiIntersector1Pluecker<4,_true>_>_>
     ::occluded(Intersectors *This,Ray *ray,RayQueryContext *context)

{
  uint *puVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  float *pfVar9;
  float *pfVar10;
  float *pfVar11;
  undefined8 uVar12;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar13;
  Scene *pSVar14;
  float **ppfVar15;
  float *pfVar16;
  float *pfVar17;
  float *pfVar18;
  float *pfVar19;
  Geometry *pGVar20;
  RTCIntersectArguments *pRVar21;
  ulong uVar22;
  byte bVar23;
  byte bVar24;
  byte bVar25;
  byte bVar26;
  byte bVar27;
  byte bVar28;
  byte bVar29;
  byte bVar30;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  byte bVar34;
  undefined8 uVar35;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  bool bVar38;
  undefined4 uVar39;
  ulong uVar40;
  ulong uVar41;
  undefined4 uVar42;
  ulong *puVar43;
  long lVar44;
  ulong unaff_RBP;
  size_t mask;
  ulong uVar45;
  ulong uVar46;
  ulong uVar47;
  ulong uVar48;
  uint *puVar49;
  int iVar50;
  ulong uVar51;
  ulong uVar52;
  size_t sVar53;
  ulong uVar54;
  NodeRef *pNVar55;
  bool bVar56;
  float fVar57;
  float fVar71;
  float fVar72;
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  float fVar73;
  float fVar74;
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  byte bVar75;
  byte bVar83;
  byte bVar84;
  byte bVar85;
  float fVar76;
  byte bVar86;
  byte bVar89;
  byte bVar90;
  float fVar87;
  float fVar88;
  float fVar91;
  float fVar92;
  float fVar93;
  float fVar94;
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  float fVar95;
  uint uVar96;
  float fVar97;
  uint uVar106;
  uint uVar108;
  vint4 ai_1;
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  float fVar107;
  float fVar109;
  float fVar110;
  uint uVar111;
  float fVar112;
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  uint uVar113;
  float fVar114;
  float fVar115;
  uint uVar122;
  uint uVar126;
  vint4 bi;
  undefined1 auVar116 [16];
  uint uVar129;
  undefined1 auVar117 [16];
  float fVar123;
  float fVar124;
  float fVar127;
  float fVar128;
  float fVar130;
  float fVar131;
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  float fVar125;
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  float fVar132;
  uint uVar133;
  float fVar134;
  float fVar137;
  uint uVar138;
  float fVar139;
  float fVar140;
  uint uVar141;
  float fVar142;
  float fVar143;
  uint uVar144;
  float fVar145;
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  uint uVar146;
  float fVar147;
  uint uVar153;
  uint uVar155;
  vint4 ai;
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  float fVar154;
  float fVar156;
  float fVar157;
  uint uVar158;
  float fVar159;
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  float fVar160;
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  float fVar164;
  float fVar165;
  undefined1 auVar163 [16];
  float fVar166;
  float fVar167;
  float fVar171;
  float fVar172;
  float fVar173;
  float fVar174;
  float fVar175;
  float fVar176;
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  float fVar177;
  float fVar178;
  float fVar181;
  float fVar182;
  float fVar184;
  float fVar185;
  float fVar186;
  undefined1 auVar179 [16];
  float fVar183;
  undefined1 auVar180 [16];
  float fVar187;
  float fVar191;
  float fVar192;
  float fVar193;
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  float fVar194;
  float fVar197;
  float fVar198;
  float fVar199;
  float fVar200;
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  float fVar201;
  float fVar202;
  float fVar203;
  float fVar204;
  float fVar205;
  float fVar206;
  float fVar208;
  float fVar209;
  float fVar210;
  float fVar211;
  float fVar212;
  float fVar213;
  undefined1 auVar207 [16];
  float fVar214;
  float fVar215;
  float fVar218;
  float fVar219;
  float fVar220;
  float fVar221;
  float fVar222;
  float fVar223;
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  int local_bb4;
  ulong local_bb0;
  ulong local_ba8;
  ulong local_ba0;
  ulong local_b98;
  ulong local_b90;
  undefined1 local_b88 [8];
  float fStack_b80;
  float fStack_b7c;
  Ray *local_b78;
  RayQueryContext *local_b70;
  float local_b68;
  float fStack_b64;
  float fStack_b60;
  float fStack_b5c;
  float local_b58;
  float fStack_b54;
  float fStack_b50;
  float fStack_b4c;
  float local_b48;
  float fStack_b44;
  float fStack_b40;
  float fStack_b3c;
  float local_b38;
  float fStack_b34;
  float fStack_b30;
  float fStack_b2c;
  float local_b28;
  float fStack_b24;
  float fStack_b20;
  float fStack_b1c;
  float local_b18;
  float fStack_b14;
  float fStack_b10;
  float fStack_b0c;
  float local_b08;
  float fStack_b04;
  float fStack_b00;
  float fStack_afc;
  float local_af8;
  float fStack_af4;
  float fStack_af0;
  float fStack_aec;
  NodeRef *local_ae0;
  HitK<1> h;
  RTCFilterFunctionNArguments args;
  Scene *scene;
  float fStack_a40;
  float fStack_a3c;
  float local_a38;
  float fStack_a34;
  float fStack_a30;
  undefined1 local_8d8 [16];
  undefined1 local_8c8 [16];
  undefined1 local_8b8 [8];
  float fStack_8b0;
  float fStack_8ac;
  undefined1 local_8a8 [16];
  undefined1 local_898 [16];
  undefined1 local_888 [16];
  undefined1 local_878 [16];
  undefined1 local_868 [16];
  undefined8 local_858;
  undefined8 uStack_850;
  undefined8 local_848;
  undefined8 uStack_840;
  undefined8 local_838;
  undefined8 uStack_830;
  float local_828;
  float fStack_824;
  float fStack_820;
  float fStack_81c;
  float local_818;
  float fStack_814;
  float fStack_810;
  float fStack_80c;
  undefined8 local_808;
  float fStack_800;
  float fStack_7fc;
  float local_7f8;
  float fStack_7f4;
  undefined8 uStack_7f0;
  float local_7e8;
  float fStack_7e4;
  float fStack_7e0;
  float fStack_7dc;
  NodeRef stack [244];
  
  if ((*(long *)&This->ptr[1].bounds.bounds0.lower.field_0 == 8) ||
     (fVar94 = ray->tfar, fVar94 < 0.0)) {
    return;
  }
  local_ae0 = stack + 1;
  stack[0].ptr = *(size_t *)&This->ptr[1].bounds.bounds0.lower.field_0;
  fVar131 = (ray->org).field_0.m128[0];
  fVar200 = (ray->org).field_0.m128[1];
  fVar57 = (ray->org).field_0.m128[2];
  aVar13 = (ray->dir).field_0.field_1;
  fVar74 = *(float *)((long)&(ray->org).field_0 + 0xc);
  fVar112 = 0.0;
  if (0.0 <= fVar74) {
    fVar112 = fVar74;
  }
  auVar58._4_4_ = -(uint)(ABS(aVar13.y) < DAT_01ff1d40._4_4_);
  auVar58._0_4_ = -(uint)(ABS(aVar13.x) < (float)DAT_01ff1d40);
  auVar58._8_4_ = -(uint)(ABS(aVar13.z) < DAT_01ff1d40._8_4_);
  auVar58._12_4_ = -(uint)(ABS(aVar13.field_3.w) < DAT_01ff1d40._12_4_);
  auVar98 = blendvps((undefined1  [16])aVar13,_DAT_01ff1d40,auVar58);
  auVar58 = rcpps(auVar58,auVar98);
  fVar177 = auVar58._0_4_;
  fVar181 = auVar58._4_4_;
  fVar184 = auVar58._8_4_;
  fVar177 = (1.0 - auVar98._0_4_ * fVar177) * fVar177 + fVar177;
  fVar181 = (1.0 - auVar98._4_4_ * fVar181) * fVar181 + fVar181;
  fVar184 = (1.0 - auVar98._8_4_ * fVar184) * fVar184 + fVar184;
  uVar46 = (ulong)(fVar177 < 0.0) << 2;
  uVar47 = uVar46 ^ 4;
  uVar48 = (ulong)((uint)(fVar181 < 0.0) * 4 + 8);
  uVar51 = uVar48 ^ 4;
  uVar52 = (ulong)((uint)(fVar184 < 0.0) * 4 + 0x10);
  uVar40 = uVar52 ^ 4;
  local_7f8 = (float)mm_lookupmask_ps._0_8_;
  fStack_7f4 = SUB84(mm_lookupmask_ps._0_8_,4);
  uStack_7f0 = mm_lookupmask_ps._8_8_;
  local_868 = mm_lookupmask_ps._240_16_;
  auVar98._8_4_ = 0xffffffff;
  auVar98._0_8_ = 0xffffffffffffffff;
  auVar98._12_4_ = 0xffffffff;
  fVar74 = fVar94;
  fVar71 = fVar94;
  fVar72 = fVar94;
  fVar88 = fVar177;
  fVar92 = fVar177;
  fVar97 = fVar177;
  fVar107 = fVar57;
  fVar109 = fVar57;
  fVar114 = fVar57;
  fVar115 = fVar112;
  fVar123 = fVar112;
  fVar124 = fVar112;
  fVar127 = fVar184;
  fVar128 = fVar184;
  fVar130 = fVar184;
  fVar134 = fVar131;
  fVar139 = fVar131;
  fVar142 = fVar131;
  fVar145 = fVar200;
  fVar147 = fVar200;
  fVar154 = fVar200;
  fVar156 = fVar181;
  fVar159 = fVar181;
  fVar160 = fVar181;
  local_bb0 = uVar51;
  local_ba8 = uVar48;
  local_ba0 = uVar47;
  local_b98 = uVar46;
  local_b90 = uVar52;
  local_b78 = ray;
  local_b70 = context;
  local_b68 = fVar181;
  fStack_b64 = fVar181;
  fStack_b60 = fVar181;
  fStack_b5c = fVar181;
  local_b58 = fVar177;
  fStack_b54 = fVar177;
  fStack_b50 = fVar177;
  fStack_b4c = fVar177;
  local_b48 = fVar200;
  fStack_b44 = fVar200;
  fStack_b40 = fVar200;
  fStack_b3c = fVar200;
  local_b38 = fVar131;
  fStack_b34 = fVar131;
  fStack_b30 = fVar131;
  fStack_b2c = fVar131;
  local_b28 = fVar184;
  fStack_b24 = fVar184;
  fStack_b20 = fVar184;
  fStack_b1c = fVar184;
  local_b18 = fVar112;
  fStack_b14 = fVar112;
  fStack_b10 = fVar112;
  fStack_b0c = fVar112;
  local_b08 = fVar57;
  fStack_b04 = fVar57;
  fStack_b00 = fVar57;
  fStack_afc = fVar57;
  local_af8 = fVar94;
  fStack_af4 = fVar94;
  fStack_af0 = fVar94;
  fStack_aec = fVar94;
LAB_00234c3a:
  if (local_ae0 == stack) {
    return;
  }
  sVar53 = local_ae0[-1].ptr;
  pNVar55 = local_ae0 + -1;
  do {
    if ((sVar53 & 8) == 0) {
      uVar41 = sVar53 & 0xfffffffffffffff0;
      puVar43 = (ulong *)(uVar41 + 0x20);
      if (uVar41 == 0) {
        puVar43 = (ulong *)0x0;
      }
      uVar45 = *puVar43;
      auVar59._8_8_ = 0;
      auVar59._0_8_ = uVar45;
      uVar12 = *(undefined8 *)((long)puVar43 + 4);
      bVar23 = (byte)uVar45;
      bVar75 = (byte)uVar12;
      bVar24 = (byte)(uVar45 >> 8);
      bVar83 = (byte)((ulong)uVar12 >> 8);
      bVar25 = (byte)(uVar45 >> 0x10);
      bVar84 = (byte)((ulong)uVar12 >> 0x10);
      bVar26 = (byte)(uVar45 >> 0x18);
      bVar85 = (byte)((ulong)uVar12 >> 0x18);
      bVar27 = (byte)(uVar45 >> 0x20);
      bVar86 = (byte)((ulong)uVar12 >> 0x20);
      bVar28 = (byte)(uVar45 >> 0x28);
      bVar89 = (byte)((ulong)uVar12 >> 0x28);
      bVar29 = (byte)(uVar45 >> 0x30);
      bVar90 = (byte)((ulong)uVar12 >> 0x30);
      bVar34 = (byte)((ulong)uVar12 >> 0x38);
      bVar30 = (byte)(uVar45 >> 0x38);
      auVar149[0] = -((byte)((bVar23 < bVar75) * bVar23 | (bVar23 >= bVar75) * bVar75) == bVar23);
      auVar149[1] = -((byte)((bVar24 < bVar83) * bVar24 | (bVar24 >= bVar83) * bVar83) == bVar24);
      auVar149[2] = -((byte)((bVar25 < bVar84) * bVar25 | (bVar25 >= bVar84) * bVar84) == bVar25);
      auVar149[3] = -((byte)((bVar26 < bVar85) * bVar26 | (bVar26 >= bVar85) * bVar85) == bVar26);
      auVar149[4] = -((byte)((bVar27 < bVar86) * bVar27 | (bVar27 >= bVar86) * bVar86) == bVar27);
      auVar149[5] = -((byte)((bVar28 < bVar89) * bVar28 | (bVar28 >= bVar89) * bVar89) == bVar28);
      auVar149[6] = -((byte)((bVar29 < bVar90) * bVar29 | (bVar29 >= bVar90) * bVar90) == bVar29);
      auVar149[7] = -((byte)((bVar30 < bVar34) * bVar30 | (bVar30 >= bVar34) * bVar34) == bVar30);
      auVar149[8] = 0xff;
      auVar149[9] = 0xff;
      auVar149[10] = 0xff;
      auVar149[0xb] = 0xff;
      auVar149[0xc] = 0xff;
      auVar149[0xd] = 0xff;
      auVar149[0xe] = 0xff;
      auVar149[0xf] = 0xff;
      auVar58 = pmovzxbd(auVar59,auVar149 ^ auVar98);
      auVar58 = auVar58 ^ auVar98;
      auVar100._0_4_ = auVar58._0_4_ << 0x1f;
      auVar100._4_4_ = auVar58._4_4_ << 0x1f;
      auVar100._8_4_ = auVar58._8_4_ << 0x1f;
      auVar100._12_4_ = auVar58._12_4_ << 0x1f;
      uVar39 = movmskps((int)uVar41,auVar100);
      fVar73 = *(float *)(puVar43 + 3);
      fVar110 = *(float *)((long)puVar43 + 0x1c);
      fVar95 = *(float *)((long)puVar43 + 0x24);
      auVar60._8_8_ = 0;
      auVar60._0_8_ = *(ulong *)((long)puVar43 + uVar46);
      auVar58 = pmovzxbd(auVar60,auVar60);
      auVar61._8_8_ = 0;
      auVar61._0_8_ = *(ulong *)((long)puVar43 + uVar47);
      auVar59 = pmovzxbd(auVar61,auVar61);
      fVar157 = *(float *)(puVar43 + 5);
      auVar99._8_8_ = 0;
      auVar99._0_8_ = *(ulong *)((long)puVar43 + uVar48);
      auVar100 = pmovzxbd(auVar99,auVar99);
      auVar101._8_8_ = 0;
      auVar101._0_8_ = *(ulong *)((long)puVar43 + uVar51);
      auVar60 = pmovzxbd(auVar101,auVar101);
      fVar183 = *(float *)((long)puVar43 + 0x2c);
      auVar116._8_8_ = 0;
      auVar116._0_8_ = *(ulong *)((long)puVar43 + uVar52);
      auVar61 = pmovzxbd(auVar116,auVar116);
      auVar148._8_8_ = 0;
      auVar148._0_8_ = *(ulong *)((long)puVar43 + uVar40);
      auVar149 = pmovzxbd(auVar148,auVar148);
      fVar125 = *(float *)(puVar43 + 4);
      fVar76 = (((float)auVar58._0_4_ * fVar95 + fVar73) - fVar131) * fVar177;
      fVar87 = (((float)auVar58._4_4_ * fVar95 + fVar73) - fVar134) * fVar88;
      fVar91 = (((float)auVar58._8_4_ * fVar95 + fVar73) - fVar139) * fVar92;
      fVar93 = (((float)auVar58._12_4_ * fVar95 + fVar73) - fVar142) * fVar97;
      fVar132 = (((float)auVar100._0_4_ * fVar157 + fVar110) - fVar200) * fVar181;
      fVar137 = (((float)auVar100._4_4_ * fVar157 + fVar110) - fVar145) * fVar156;
      fVar140 = (((float)auVar100._8_4_ * fVar157 + fVar110) - fVar147) * fVar159;
      fVar143 = (((float)auVar100._12_4_ * fVar157 + fVar110) - fVar154) * fVar160;
      uVar133 = (uint)((int)fVar132 < (int)fVar76) * (int)fVar76 |
                (uint)((int)fVar132 >= (int)fVar76) * (int)fVar132;
      uVar138 = (uint)((int)fVar137 < (int)fVar87) * (int)fVar87 |
                (uint)((int)fVar137 >= (int)fVar87) * (int)fVar137;
      uVar141 = (uint)((int)fVar140 < (int)fVar91) * (int)fVar91 |
                (uint)((int)fVar140 >= (int)fVar91) * (int)fVar140;
      uVar144 = (uint)((int)fVar143 < (int)fVar93) * (int)fVar93 |
                (uint)((int)fVar143 >= (int)fVar93) * (int)fVar143;
      fVar76 = (((float)auVar61._0_4_ * fVar183 + fVar125) - fVar57) * fVar184;
      fVar87 = (((float)auVar61._4_4_ * fVar183 + fVar125) - fVar107) * fVar127;
      fVar91 = (((float)auVar61._8_4_ * fVar183 + fVar125) - fVar109) * fVar128;
      fVar93 = (((float)auVar61._12_4_ * fVar183 + fVar125) - fVar114) * fVar130;
      uVar113 = (uint)((int)fVar76 < (int)fVar112) * (int)fVar112 |
                (uint)((int)fVar76 >= (int)fVar112) * (int)fVar76;
      uVar122 = (uint)((int)fVar87 < (int)fVar115) * (int)fVar115 |
                (uint)((int)fVar87 >= (int)fVar115) * (int)fVar87;
      uVar126 = (uint)((int)fVar91 < (int)fVar123) * (int)fVar123 |
                (uint)((int)fVar91 >= (int)fVar123) * (int)fVar91;
      uVar129 = (uint)((int)fVar93 < (int)fVar124) * (int)fVar124 |
                (uint)((int)fVar93 >= (int)fVar124) * (int)fVar93;
      fVar76 = (((float)auVar59._0_4_ * fVar95 + fVar73) - fVar131) * fVar177;
      fVar87 = (((float)auVar59._4_4_ * fVar95 + fVar73) - fVar134) * fVar88;
      fVar91 = (((float)auVar59._8_4_ * fVar95 + fVar73) - fVar139) * fVar92;
      fVar73 = (((float)auVar59._12_4_ * fVar95 + fVar73) - fVar142) * fVar97;
      fVar95 = (((float)auVar60._0_4_ * fVar157 + fVar110) - fVar200) * fVar181;
      fVar93 = (((float)auVar60._4_4_ * fVar157 + fVar110) - fVar145) * fVar156;
      fVar132 = (((float)auVar60._8_4_ * fVar157 + fVar110) - fVar147) * fVar159;
      fVar110 = (((float)auVar60._12_4_ * fVar157 + fVar110) - fVar154) * fVar160;
      uVar96 = (uint)((int)fVar76 < (int)fVar95) * (int)fVar76 |
               (uint)((int)fVar76 >= (int)fVar95) * (int)fVar95;
      uVar106 = (uint)((int)fVar87 < (int)fVar93) * (int)fVar87 |
                (uint)((int)fVar87 >= (int)fVar93) * (int)fVar93;
      uVar108 = (uint)((int)fVar91 < (int)fVar132) * (int)fVar91 |
                (uint)((int)fVar91 >= (int)fVar132) * (int)fVar132;
      uVar111 = (uint)((int)fVar73 < (int)fVar110) * (int)fVar73 |
                (uint)((int)fVar73 >= (int)fVar110) * (int)fVar110;
      fVar73 = (((float)auVar149._0_4_ * fVar183 + fVar125) - fVar57) * fVar184;
      fVar110 = (((float)auVar149._4_4_ * fVar183 + fVar125) - fVar107) * fVar127;
      fVar95 = (((float)auVar149._8_4_ * fVar183 + fVar125) - fVar109) * fVar128;
      fVar157 = (((float)auVar149._12_4_ * fVar183 + fVar125) - fVar114) * fVar130;
      uVar146 = (uint)((int)fVar94 < (int)fVar73) * (int)fVar94 |
                (uint)((int)fVar94 >= (int)fVar73) * (int)fVar73;
      uVar153 = (uint)((int)fVar74 < (int)fVar110) * (int)fVar74 |
                (uint)((int)fVar74 >= (int)fVar110) * (int)fVar110;
      uVar155 = (uint)((int)fVar71 < (int)fVar95) * (int)fVar71 |
                (uint)((int)fVar71 >= (int)fVar95) * (int)fVar95;
      uVar158 = (uint)((int)fVar72 < (int)fVar157) * (int)fVar72 |
                (uint)((int)fVar72 >= (int)fVar157) * (int)fVar157;
      auVar117._0_4_ =
           -(uint)((int)(((int)uVar96 < (int)uVar146) * uVar96 |
                        ((int)uVar96 >= (int)uVar146) * uVar146) <
                  (int)(((int)uVar113 < (int)uVar133) * uVar133 |
                       ((int)uVar113 >= (int)uVar133) * uVar113));
      auVar117._4_4_ =
           -(uint)((int)(((int)uVar106 < (int)uVar153) * uVar106 |
                        ((int)uVar106 >= (int)uVar153) * uVar153) <
                  (int)(((int)uVar122 < (int)uVar138) * uVar138 |
                       ((int)uVar122 >= (int)uVar138) * uVar122));
      auVar117._8_4_ =
           -(uint)((int)(((int)uVar108 < (int)uVar155) * uVar108 |
                        ((int)uVar108 >= (int)uVar155) * uVar155) <
                  (int)(((int)uVar126 < (int)uVar141) * uVar141 |
                       ((int)uVar126 >= (int)uVar141) * uVar126));
      auVar117._12_4_ =
           -(uint)((int)(((int)uVar111 < (int)uVar158) * uVar111 |
                        ((int)uVar111 >= (int)uVar158) * uVar158) <
                  (int)(((int)uVar129 < (int)uVar144) * uVar144 |
                       ((int)uVar129 >= (int)uVar144) * uVar129));
      uVar42 = movmskps((int)puVar43,auVar117);
      unaff_RBP = (ulong)(byte)(~(byte)uVar42 & (byte)uVar39);
    }
    if ((sVar53 & 8) == 0) {
      if (unaff_RBP == 0) {
        iVar50 = 4;
      }
      else {
        uVar41 = sVar53 & 0xfffffffffffffff0;
        lVar44 = 0;
        if (unaff_RBP != 0) {
          for (; (unaff_RBP >> lVar44 & 1) == 0; lVar44 = lVar44 + 1) {
          }
        }
        iVar50 = 0;
        sVar53 = *(size_t *)(uVar41 + lVar44 * 8);
        uVar45 = unaff_RBP - 1 & unaff_RBP;
        if (uVar45 != 0) {
          pNVar55->ptr = sVar53;
          lVar44 = 0;
          if (uVar45 != 0) {
            for (; (uVar45 >> lVar44 & 1) == 0; lVar44 = lVar44 + 1) {
            }
          }
          uVar54 = uVar45 - 1;
          while( true ) {
            pNVar55 = pNVar55 + 1;
            sVar53 = *(size_t *)(uVar41 + lVar44 * 8);
            uVar54 = uVar54 & uVar45;
            if (uVar54 == 0) break;
            pNVar55->ptr = sVar53;
            lVar44 = 0;
            if (uVar54 != 0) {
              for (; (uVar54 >> lVar44 & 1) == 0; lVar44 = lVar44 + 1) {
              }
            }
            uVar45 = uVar54 - 1;
          }
        }
      }
    }
    else {
      iVar50 = 6;
    }
  } while (iVar50 == 0);
  local_ae0 = pNVar55;
  if (iVar50 == 6) {
    uVar41 = (ulong)((uint)sVar53 & 0xf);
    iVar50 = 0;
    uVar45 = uVar41 - 8;
    bVar56 = uVar41 != 8;
    if (bVar56) {
      uVar41 = 0;
      do {
        pSVar14 = context->scene;
        puVar1 = (uint *)(uVar41 * 0x60 + (sVar53 & 0xfffffffffffffff0));
        puVar49 = puVar1 + 0x10;
        ppfVar15 = (pSVar14->vertices).items;
        pfVar16 = ppfVar15[*puVar49];
        pfVar2 = pfVar16 + *puVar1;
        pfVar3 = pfVar16 + puVar1[4];
        pfVar4 = pfVar16 + puVar1[0xc];
        fVar73 = *pfVar4;
        fVar110 = pfVar4[1];
        fVar95 = pfVar4[2];
        pfVar17 = ppfVar15[puVar1[0x11]];
        pfVar4 = pfVar17 + puVar1[1];
        pfVar5 = pfVar17 + puVar1[5];
        pfVar6 = pfVar17 + puVar1[0xd];
        fVar157 = *pfVar6;
        fVar183 = pfVar6[1];
        fVar125 = pfVar6[2];
        pfVar18 = ppfVar15[puVar1[0x12]];
        pfVar6 = pfVar18 + puVar1[2];
        pfVar7 = pfVar18 + puVar1[6];
        local_7f8 = pfVar7[2];
        pfVar8 = pfVar18 + puVar1[0xe];
        fVar76 = *pfVar8;
        fVar87 = pfVar8[1];
        pfVar19 = ppfVar15[puVar1[0x13]];
        pfVar9 = pfVar19 + puVar1[3];
        pfVar10 = pfVar19 + puVar1[7];
        fStack_7f4 = pfVar10[2];
        pfVar11 = pfVar19 + puVar1[0xf];
        fVar91 = *pfVar11;
        fVar93 = pfVar11[1];
        fVar94 = (ray->org).field_0.m128[0];
        fVar74 = (ray->org).field_0.m128[1];
        fVar112 = (ray->org).field_0.m128[2];
        fVar205 = *pfVar2 - fVar94;
        fVar208 = *pfVar4 - fVar94;
        fVar210 = *pfVar6 - fVar94;
        fVar212 = *pfVar9 - fVar94;
        fVar214 = pfVar2[1] - fVar74;
        fVar218 = pfVar4[1] - fVar74;
        fVar220 = pfVar6[1] - fVar74;
        fVar222 = pfVar9[1] - fVar74;
        fVar187 = pfVar2[2] - fVar112;
        fVar191 = pfVar4[2] - fVar112;
        fVar192 = pfVar6[2] - fVar112;
        fVar193 = pfVar9[2] - fVar112;
        local_828 = *pfVar3;
        fStack_824 = *pfVar5;
        fStack_820 = *pfVar7;
        fStack_81c = *pfVar10;
        fVar160 = *pfVar3 - fVar94;
        fVar181 = *pfVar5 - fVar94;
        fVar132 = *pfVar7 - fVar94;
        fVar137 = *pfVar10 - fVar94;
        local_818 = pfVar3[1];
        fStack_814 = pfVar5[1];
        fStack_810 = pfVar7[1];
        fStack_80c = pfVar10[1];
        fVar194 = pfVar3[1] - fVar74;
        fVar197 = pfVar5[1] - fVar74;
        fVar198 = pfVar7[1] - fVar74;
        fVar199 = pfVar10[1] - fVar74;
        local_808 = CONCAT44(pfVar5[2],pfVar3[2]);
        fVar114 = pfVar3[2] - fVar112;
        fVar123 = pfVar5[2] - fVar112;
        fVar127 = local_7f8 - fVar112;
        fVar130 = fStack_7f4 - fVar112;
        fVar177 = fVar73 - fVar94;
        fVar88 = fVar157 - fVar94;
        fVar92 = fVar76 - fVar94;
        fVar94 = fVar91 - fVar94;
        fVar57 = fVar110 - fVar74;
        fVar71 = fVar183 - fVar74;
        fVar72 = fVar87 - fVar74;
        fVar74 = fVar93 - fVar74;
        fVar97 = fVar95 - fVar112;
        fVar107 = fVar125 - fVar112;
        fVar109 = pfVar8[2] - fVar112;
        fVar112 = pfVar11[2] - fVar112;
        fVar115 = fVar57 - fVar214;
        fVar124 = fVar71 - fVar218;
        fVar128 = fVar72 - fVar220;
        fVar184 = fVar74 - fVar222;
        fVar166 = fVar97 - fVar187;
        fVar171 = fVar107 - fVar191;
        fVar173 = fVar109 - fVar192;
        fVar175 = fVar112 - fVar193;
        fVar178 = fVar177 - fVar205;
        fVar182 = fVar88 - fVar208;
        fVar185 = fVar92 - fVar210;
        fVar186 = fVar94 - fVar212;
        fVar131 = (ray->dir).field_0.m128[0];
        local_b88._4_4_ = (ray->dir).field_0.m128[1];
        fVar200 = (ray->dir).field_0.m128[2];
        fVar134 = (fVar115 * (fVar97 + fVar187) - fVar166 * (fVar57 + fVar214)) * fVar131 +
                  (fVar166 * (fVar177 + fVar205) - (fVar97 + fVar187) * fVar178) *
                  (float)local_b88._4_4_ +
                  ((fVar57 + fVar214) * fVar178 - (fVar177 + fVar205) * fVar115) * fVar200;
        fVar139 = (fVar124 * (fVar107 + fVar191) - fVar171 * (fVar71 + fVar218)) * fVar131 +
                  (fVar171 * (fVar88 + fVar208) - (fVar107 + fVar191) * fVar182) *
                  (float)local_b88._4_4_ +
                  ((fVar71 + fVar218) * fVar182 - (fVar88 + fVar208) * fVar124) * fVar200;
        fVar142 = (fVar128 * (fVar109 + fVar192) - fVar173 * (fVar72 + fVar220)) * fVar131 +
                  (fVar173 * (fVar92 + fVar210) - (fVar109 + fVar192) * fVar185) *
                  (float)local_b88._4_4_ +
                  ((fVar72 + fVar220) * fVar185 - (fVar92 + fVar210) * fVar128) * fVar200;
        fVar145 = (fVar184 * (fVar112 + fVar193) - fVar175 * (fVar74 + fVar222)) * fVar131 +
                  (fVar175 * (fVar94 + fVar212) - (fVar112 + fVar193) * fVar186) *
                  (float)local_b88._4_4_ +
                  ((fVar74 + fVar222) * fVar186 - (fVar94 + fVar212) * fVar184) * fVar200;
        fVar201 = fVar214 - fVar194;
        fVar202 = fVar218 - fVar197;
        fVar203 = fVar220 - fVar198;
        fVar204 = fVar222 - fVar199;
        fVar147 = fVar187 - fVar114;
        fVar154 = fVar191 - fVar123;
        fVar156 = fVar192 - fVar127;
        fVar159 = fVar193 - fVar130;
        fVar167 = fVar205 - fVar160;
        fVar172 = fVar208 - fVar181;
        fVar174 = fVar210 - fVar132;
        fVar176 = fVar212 - fVar137;
        auVar188._0_4_ =
             (fVar201 * (fVar187 + fVar114) - fVar147 * (fVar214 + fVar194)) * fVar131 +
             (fVar147 * (fVar205 + fVar160) - (fVar187 + fVar114) * fVar167) *
             (float)local_b88._4_4_ +
             ((fVar214 + fVar194) * fVar167 - (fVar205 + fVar160) * fVar201) * fVar200;
        auVar188._4_4_ =
             (fVar202 * (fVar191 + fVar123) - fVar154 * (fVar218 + fVar197)) * fVar131 +
             (fVar154 * (fVar208 + fVar181) - (fVar191 + fVar123) * fVar172) *
             (float)local_b88._4_4_ +
             ((fVar218 + fVar197) * fVar172 - (fVar208 + fVar181) * fVar202) * fVar200;
        auVar188._8_4_ =
             (fVar203 * (fVar192 + fVar127) - fVar156 * (fVar220 + fVar198)) * fVar131 +
             (fVar156 * (fVar210 + fVar132) - (fVar192 + fVar127) * fVar174) *
             (float)local_b88._4_4_ +
             ((fVar220 + fVar198) * fVar174 - (fVar210 + fVar132) * fVar203) * fVar200;
        auVar188._12_4_ =
             (fVar204 * (fVar193 + fVar130) - fVar159 * (fVar222 + fVar199)) * fVar131 +
             (fVar159 * (fVar212 + fVar137) - (fVar193 + fVar130) * fVar176) *
             (float)local_b88._4_4_ +
             ((fVar222 + fVar199) * fVar176 - (fVar212 + fVar137) * fVar204) * fVar200;
        fVar140 = fVar160 - fVar177;
        fVar143 = fVar181 - fVar88;
        fVar164 = fVar132 - fVar92;
        fVar165 = fVar137 - fVar94;
        fVar206 = fVar194 - fVar57;
        fVar209 = fVar197 - fVar71;
        fVar211 = fVar198 - fVar72;
        fVar213 = fVar199 - fVar74;
        fVar215 = fVar114 - fVar97;
        fVar219 = fVar123 - fVar107;
        fVar221 = fVar127 - fVar109;
        fVar223 = fVar130 - fVar112;
        local_b88._0_4_ = local_b88._4_4_;
        fStack_b80 = (float)local_b88._4_4_;
        fStack_b7c = (float)local_b88._4_4_;
        fVar57 = (fVar206 * (fVar97 + fVar114) - fVar215 * (fVar57 + fVar194)) * fVar131 +
                 (fVar215 * (fVar177 + fVar160) - (fVar97 + fVar114) * fVar140) *
                 (float)local_b88._4_4_ +
                 ((fVar57 + fVar194) * fVar140 - (fVar177 + fVar160) * fVar206) * fVar200;
        fVar71 = (fVar209 * (fVar107 + fVar123) - fVar219 * (fVar71 + fVar197)) * fVar131 +
                 (fVar219 * (fVar88 + fVar181) - (fVar107 + fVar123) * fVar143) *
                 (float)local_b88._4_4_ +
                 ((fVar71 + fVar197) * fVar143 - (fVar88 + fVar181) * fVar209) * fVar200;
        fVar72 = (fVar211 * (fVar109 + fVar127) - fVar221 * (fVar72 + fVar198)) * fVar131 +
                 (fVar221 * (fVar92 + fVar132) - (fVar109 + fVar127) * fVar164) *
                 (float)local_b88._4_4_ +
                 ((fVar72 + fVar198) * fVar164 - (fVar92 + fVar132) * fVar211) * fVar200;
        fVar94 = (fVar213 * (fVar112 + fVar130) - fVar223 * (fVar74 + fVar199)) * fVar131 +
                 (fVar223 * (fVar94 + fVar137) - (fVar112 + fVar130) * fVar165) *
                 (float)local_b88._4_4_ +
                 ((fVar74 + fVar199) * fVar165 - (fVar94 + fVar137) * fVar213) * fVar200;
        fVar177 = fVar134 + auVar188._0_4_ + fVar57;
        fVar88 = fVar139 + auVar188._4_4_ + fVar71;
        fVar92 = fVar142 + auVar188._8_4_ + fVar72;
        fVar97 = fVar145 + auVar188._12_4_ + fVar94;
        auVar62._8_4_ = fVar142;
        auVar62._0_8_ = CONCAT44(fVar139,fVar134);
        auVar62._12_4_ = fVar145;
        auVar58 = minps(auVar62,auVar188);
        auVar31._4_4_ = fVar71;
        auVar31._0_4_ = fVar57;
        auVar31._8_4_ = fVar72;
        auVar31._12_4_ = fVar94;
        auVar58 = minps(auVar58,auVar31);
        auVar161._8_4_ = fVar142;
        auVar161._0_8_ = CONCAT44(fVar139,fVar134);
        auVar161._12_4_ = fVar145;
        auVar98 = maxps(auVar161,auVar188);
        auVar32._4_4_ = fVar71;
        auVar32._0_4_ = fVar57;
        auVar32._8_4_ = fVar72;
        auVar32._12_4_ = fVar94;
        auVar98 = maxps(auVar98,auVar32);
        fVar94 = ABS(fVar177) * 1.1920929e-07;
        fVar74 = ABS(fVar88) * 1.1920929e-07;
        fVar112 = ABS(fVar92) * 1.1920929e-07;
        fVar57 = ABS(fVar97) * 1.1920929e-07;
        auVar162._4_4_ = -(uint)(auVar98._4_4_ <= fVar74);
        auVar162._0_4_ = -(uint)(auVar98._0_4_ <= fVar94);
        auVar162._8_4_ = -(uint)(auVar98._8_4_ <= fVar112);
        auVar162._12_4_ = -(uint)(auVar98._12_4_ <= fVar57);
        auVar63._4_4_ = -(uint)(-fVar74 <= auVar58._4_4_);
        auVar63._0_4_ = -(uint)(-fVar94 <= auVar58._0_4_);
        auVar63._8_4_ = -(uint)(-fVar112 <= auVar58._8_4_);
        auVar63._12_4_ = -(uint)(-fVar57 <= auVar58._12_4_);
        auVar162 = auVar162 | auVar63;
        lVar44 = (sVar53 & 0xfffffffffffffff0) + uVar41 * 0x60;
        uVar96 = puVar1[8];
        iVar50 = movmskps((int)uVar51,auVar162);
        uVar12 = *(undefined8 *)(pfVar16 + uVar96);
        uVar35 = *(undefined8 *)(pfVar16 + uVar96 + 2);
        local_838 = *(undefined8 *)(pfVar17 + puVar1[9]);
        uStack_830 = *(undefined8 *)(pfVar17 + puVar1[9] + 2);
        local_858 = *(undefined8 *)(pfVar18 + puVar1[10]);
        uStack_850 = *(undefined8 *)(pfVar18 + puVar1[10] + 2);
        local_848 = *(undefined8 *)(pfVar19 + puVar1[0xb]);
        uStack_840 = *(undefined8 *)(pfVar19 + puVar1[0xb] + 2);
        context = local_b70;
        ray = local_b78;
        uVar46 = local_b98;
        uVar47 = local_ba0;
        uVar48 = local_ba8;
        uVar51 = local_bb0;
        if (iVar50 != 0) {
          local_7e8 = fVar140;
          fStack_7e4 = fVar143;
          fStack_7e0 = fVar164;
          fStack_7dc = fVar165;
          auVar189._0_4_ = fVar115 * fVar147 - fVar166 * fVar201;
          auVar189._4_4_ = fVar124 * fVar154 - fVar171 * fVar202;
          auVar189._8_4_ = fVar128 * fVar156 - fVar173 * fVar203;
          auVar189._12_4_ = fVar184 * fVar159 - fVar175 * fVar204;
          auVar150._0_4_ = fVar201 * fVar215 - fVar147 * fVar206;
          auVar150._4_4_ = fVar202 * fVar219 - fVar154 * fVar209;
          auVar150._8_4_ = fVar203 * fVar221 - fVar156 * fVar211;
          auVar150._12_4_ = fVar204 * fVar223 - fVar159 * fVar213;
          auVar64._4_4_ = -(uint)(ABS(fVar171 * fVar202) < ABS(fVar154 * fVar209));
          auVar64._0_4_ = -(uint)(ABS(fVar166 * fVar201) < ABS(fVar147 * fVar206));
          auVar64._8_4_ = -(uint)(ABS(fVar173 * fVar203) < ABS(fVar156 * fVar211));
          auVar64._12_4_ = -(uint)(ABS(fVar175 * fVar204) < ABS(fVar159 * fVar213));
          fVar109 = (float)DAT_01feca10;
          fVar114 = DAT_01feca10._4_4_;
          fVar123 = DAT_01feca10._12_4_;
          local_8a8 = blendvps(auVar150,auVar189,auVar64);
          auVar216._0_4_ = fVar166 * fVar167 - fVar178 * fVar147;
          auVar216._4_4_ = fVar171 * fVar172 - fVar182 * fVar154;
          auVar216._8_4_ = fVar173 * fVar174 - fVar185 * fVar156;
          auVar216._12_4_ = fVar175 * fVar176 - fVar186 * fVar159;
          auVar135._0_4_ = fVar147 * fVar140 - fVar167 * fVar215;
          auVar135._4_4_ = fVar154 * fVar143 - fVar172 * fVar219;
          auVar135._8_4_ = fVar156 * fVar164 - fVar174 * fVar221;
          auVar135._12_4_ = fVar159 * fVar165 - fVar176 * fVar223;
          auVar65._4_4_ = -(uint)(ABS(fVar182 * fVar154) < ABS(fVar172 * fVar219));
          auVar65._0_4_ = -(uint)(ABS(fVar178 * fVar147) < ABS(fVar167 * fVar215));
          auVar65._8_4_ = -(uint)(ABS(fVar185 * fVar156) < ABS(fVar174 * fVar221));
          auVar65._12_4_ = -(uint)(ABS(fVar186 * fVar159) < ABS(fVar176 * fVar223));
          local_898 = blendvps(auVar135,auVar216,auVar65);
          auVar168._0_4_ = fVar167 * fVar206 - fVar201 * fVar140;
          auVar168._4_4_ = fVar172 * fVar209 - fVar202 * fVar143;
          auVar168._8_4_ = fVar174 * fVar211 - fVar203 * fVar164;
          auVar168._12_4_ = fVar176 * fVar213 - fVar204 * fVar165;
          auVar66._4_4_ = -(uint)(ABS(fVar124 * fVar172) < ABS(fVar202 * fVar143));
          auVar66._0_4_ = -(uint)(ABS(fVar115 * fVar167) < ABS(fVar201 * fVar140));
          auVar66._8_4_ = -(uint)(ABS(fVar128 * fVar174) < ABS(fVar203 * fVar164));
          auVar66._12_4_ = -(uint)(ABS(fVar184 * fVar176) < ABS(fVar204 * fVar165));
          auVar33._4_4_ = fVar182 * fVar202 - fVar124 * fVar172;
          auVar33._0_4_ = fVar178 * fVar201 - fVar115 * fVar167;
          auVar33._8_4_ = fVar185 * fVar203 - fVar128 * fVar174;
          auVar33._12_4_ = fVar186 * fVar204 - fVar184 * fVar176;
          local_888 = blendvps(auVar168,auVar33,auVar66);
          fVar94 = fVar131 * local_8a8._0_4_ +
                   (float)local_b88._4_4_ * local_898._0_4_ + fVar200 * local_888._0_4_;
          fVar74 = fVar131 * local_8a8._4_4_ +
                   (float)local_b88._4_4_ * local_898._4_4_ + fVar200 * local_888._4_4_;
          fVar112 = fVar131 * local_8a8._8_4_ +
                    (float)local_b88._4_4_ * local_898._8_4_ + fVar200 * local_888._8_4_;
          fVar131 = fVar131 * local_8a8._12_4_ +
                    (float)local_b88._4_4_ * local_898._12_4_ + fVar200 * local_888._12_4_;
          auVar118._0_4_ = fVar94 + fVar94;
          auVar118._4_4_ = fVar74 + fVar74;
          auVar118._8_4_ = fVar112 + fVar112;
          auVar118._12_4_ = fVar131 + fVar131;
          auVar77._0_4_ = fVar214 * local_898._0_4_ + fVar187 * local_888._0_4_;
          auVar77._4_4_ = fVar218 * local_898._4_4_ + fVar191 * local_888._4_4_;
          auVar77._8_4_ = fVar220 * local_898._8_4_ + fVar192 * local_888._8_4_;
          auVar77._12_4_ = fVar222 * local_898._12_4_ + fVar193 * local_888._12_4_;
          fVar57 = fVar205 * local_8a8._0_4_ + auVar77._0_4_;
          fVar71 = fVar208 * local_8a8._4_4_ + auVar77._4_4_;
          fVar72 = fVar210 * local_8a8._8_4_ + auVar77._8_4_;
          fVar107 = fVar212 * local_8a8._12_4_ + auVar77._12_4_;
          auVar58 = rcpps(auVar77,auVar118);
          fVar94 = auVar58._0_4_;
          fVar74 = auVar58._4_4_;
          fVar131 = auVar58._8_4_;
          fVar200 = auVar58._12_4_;
          fVar112 = DAT_01feca10._8_4_;
          local_8b8._0_4_ =
               ((fVar109 - auVar118._0_4_ * fVar94) * fVar94 + fVar94) * (fVar57 + fVar57);
          local_8b8._4_4_ =
               ((fVar114 - auVar118._4_4_ * fVar74) * fVar74 + fVar74) * (fVar71 + fVar71);
          fStack_8b0 = ((fVar112 - auVar118._8_4_ * fVar131) * fVar131 + fVar131) *
                       (fVar72 + fVar72);
          fStack_8ac = ((fVar123 - auVar118._12_4_ * fVar200) * fVar200 + fVar200) *
                       (fVar107 + fVar107);
          fVar94 = local_b78->tfar;
          fVar74 = (local_b78->org).field_0.m128[3];
          auVar102._0_4_ =
               -(uint)((float)local_8b8._0_4_ <= fVar94 && fVar74 <= (float)local_8b8._0_4_);
          auVar102._4_4_ =
               -(uint)((float)local_8b8._4_4_ <= fVar94 && fVar74 <= (float)local_8b8._4_4_);
          auVar102._8_4_ = -(uint)(fStack_8b0 <= fVar94 && fVar74 <= fStack_8b0);
          auVar102._12_4_ = -(uint)(fStack_8ac <= fVar94 && fVar74 <= fStack_8ac);
          auVar119._0_4_ = -(uint)(auVar118._0_4_ != 0.0) & auVar162._0_4_ & auVar102._0_4_;
          auVar119._4_4_ = -(uint)(auVar118._4_4_ != 0.0) & auVar162._4_4_ & auVar102._4_4_;
          auVar119._8_4_ = -(uint)(auVar118._8_4_ != 0.0) & auVar162._8_4_ & auVar102._8_4_;
          auVar119._12_4_ = -(uint)(auVar118._12_4_ != 0.0) & auVar162._12_4_ & auVar102._12_4_;
          uVar96 = movmskps(uVar96,auVar119);
          if (uVar96 != 0) {
            auVar36._4_4_ = fVar88;
            auVar36._0_4_ = fVar177;
            auVar36._8_4_ = fVar92;
            auVar36._12_4_ = fVar97;
            local_878._4_4_ = fStack_7f4;
            local_878._0_4_ = local_7f8;
            local_878._8_8_ = uStack_7f0;
            auVar58 = rcpps(auVar102,auVar36);
            fVar94 = auVar58._0_4_;
            fVar74 = auVar58._4_4_;
            fVar131 = auVar58._8_4_;
            fVar200 = auVar58._12_4_;
            fVar94 = (float)(-(uint)(1e-18 <= ABS(fVar177)) &
                            (uint)((fVar109 - fVar177 * fVar94) * fVar94 + fVar94));
            fVar74 = (float)(-(uint)(1e-18 <= ABS(fVar88)) &
                            (uint)((fVar114 - fVar88 * fVar74) * fVar74 + fVar74));
            fVar131 = (float)(-(uint)(1e-18 <= ABS(fVar92)) &
                             (uint)((fVar112 - fVar92 * fVar131) * fVar131 + fVar131));
            fVar200 = (float)(-(uint)(1e-18 <= ABS(fVar97)) &
                             (uint)((fVar123 - fVar97 * fVar200) * fVar200 + fVar200));
            auVar179._0_4_ = fVar134 * fVar94;
            auVar179._4_4_ = fVar139 * fVar74;
            auVar179._8_4_ = fVar142 * fVar131;
            auVar179._12_4_ = fVar145 * fVar200;
            auVar58 = minps(auVar179,_DAT_01feca10);
            auVar195._0_4_ = fVar94 * auVar188._0_4_;
            auVar195._4_4_ = fVar74 * auVar188._4_4_;
            auVar195._8_4_ = fVar131 * auVar188._8_4_;
            auVar195._12_4_ = fVar200 * auVar188._12_4_;
            auVar98 = minps(auVar195,_DAT_01feca10);
            auVar78._0_4_ = fVar109 - auVar58._0_4_;
            auVar78._4_4_ = fVar114 - auVar58._4_4_;
            auVar78._8_4_ = fVar112 - auVar58._8_4_;
            auVar78._12_4_ = fVar123 - auVar58._12_4_;
            auVar103._0_4_ = fVar109 - auVar98._0_4_;
            auVar103._4_4_ = fVar114 - auVar98._4_4_;
            auVar103._8_4_ = fVar112 - auVar98._8_4_;
            auVar103._12_4_ = fVar123 - auVar98._12_4_;
            local_8d8 = blendvps(auVar58,auVar78,local_878);
            local_8c8 = blendvps(auVar98,auVar103,local_878);
            uVar54 = (ulong)(byte)uVar96;
            auVar98._8_4_ = 0xffffffff;
            auVar98._0_8_ = 0xffffffffffffffff;
            auVar98._12_4_ = 0xffffffff;
            fVar94 = local_af8;
            fVar74 = fStack_af4;
            fVar71 = fStack_af0;
            fVar72 = fStack_aec;
            fVar177 = local_b58;
            fVar88 = fStack_b54;
            fVar92 = fStack_b50;
            fVar97 = fStack_b4c;
            fVar57 = local_b08;
            fVar107 = fStack_b04;
            fVar109 = fStack_b00;
            fVar114 = fStack_afc;
            fVar112 = local_b18;
            fVar115 = fStack_b14;
            fVar123 = fStack_b10;
            fVar124 = fStack_b0c;
            fVar184 = local_b28;
            fVar127 = fStack_b24;
            fVar128 = fStack_b20;
            fVar130 = fStack_b1c;
            fVar131 = local_b38;
            fVar134 = fStack_b34;
            fVar139 = fStack_b30;
            fVar142 = fStack_b2c;
            fVar200 = local_b48;
            fVar145 = fStack_b44;
            fVar147 = fStack_b40;
            fVar154 = fStack_b3c;
            fVar181 = local_b68;
            fVar156 = fStack_b64;
            fVar159 = fStack_b60;
            fVar160 = fStack_b5c;
            do {
              uVar22 = 0;
              if (uVar54 != 0) {
                for (; (uVar54 >> uVar22 & 1) == 0; uVar22 = uVar22 + 1) {
                }
              }
              h.geomID = puVar49[uVar22];
              pGVar20 = (pSVar14->geometries).items[h.geomID].ptr;
              if ((pGVar20->mask & ray->mask) == 0) {
                uVar54 = uVar54 ^ 1L << (uVar22 & 0x3f);
                uVar96 = (uint)CONCAT71((uint7)(uint3)(h.geomID >> 8),1);
              }
              else {
                pRVar21 = context->args;
                if ((pRVar21->filter == (RTCFilterFunctionN)0x0) &&
                   (pGVar20->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
                  uVar96 = 0;
                  uVar52 = local_b90;
                }
                else {
                  h.u = *(float *)(local_8d8 + uVar22 * 4);
                  h.v = *(float *)(local_8c8 + uVar22 * 4);
                  args.context = context->user;
                  h.primID = *(uint *)(lVar44 + 0x50 + uVar22 * 4);
                  h.Ng.field_0.field_0.x = (float)*(undefined4 *)(local_8a8 + uVar22 * 4);
                  h.Ng.field_0.field_0.y = (float)*(undefined4 *)(local_898 + uVar22 * 4);
                  h.Ng.field_0.field_0.z = (float)*(undefined4 *)(local_888 + uVar22 * 4);
                  h.instID[0] = (args.context)->instID[0];
                  h.instPrimID[0] = (args.context)->instPrimID[0];
                  local_b88._0_4_ = ray->tfar;
                  ray->tfar = *(float *)(local_8b8 + uVar22 * 4);
                  local_bb4 = -1;
                  args.valid = &local_bb4;
                  args.geometryUserPtr = pGVar20->userPtr;
                  args.hit = (RTCHitN *)&h;
                  args.N = 1;
                  args.ray = (RTCRayN *)ray;
                  if (pGVar20->occlusionFilterN == (RTCFilterFunctionN)0x0) {
LAB_00235745:
                    if (pRVar21->filter != (RTCFilterFunctionN)0x0) {
                      if (((pRVar21->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                         (((pGVar20->field_8).field_0x2 & 0x40) != 0)) {
                        (*pRVar21->filter)(&args);
                        auVar98._8_4_ = 0xffffffff;
                        auVar98._0_8_ = 0xffffffffffffffff;
                        auVar98._12_4_ = 0xffffffff;
                        context = local_b70;
                        ray = local_b78;
                        uVar46 = local_b98;
                        uVar47 = local_ba0;
                        uVar48 = local_ba8;
                        uVar51 = local_bb0;
                        fVar94 = local_af8;
                        fVar74 = fStack_af4;
                        fVar71 = fStack_af0;
                        fVar72 = fStack_aec;
                        fVar177 = local_b58;
                        fVar88 = fStack_b54;
                        fVar92 = fStack_b50;
                        fVar97 = fStack_b4c;
                        fVar57 = local_b08;
                        fVar107 = fStack_b04;
                        fVar109 = fStack_b00;
                        fVar114 = fStack_afc;
                        fVar112 = local_b18;
                        fVar115 = fStack_b14;
                        fVar123 = fStack_b10;
                        fVar124 = fStack_b0c;
                        fVar184 = local_b28;
                        fVar127 = fStack_b24;
                        fVar128 = fStack_b20;
                        fVar130 = fStack_b1c;
                        fVar131 = local_b38;
                        fVar134 = fStack_b34;
                        fVar139 = fStack_b30;
                        fVar142 = fStack_b2c;
                        fVar200 = local_b48;
                        fVar145 = fStack_b44;
                        fVar147 = fStack_b40;
                        fVar154 = fStack_b3c;
                        fVar181 = local_b68;
                        fVar156 = fStack_b64;
                        fVar159 = fStack_b60;
                        fVar160 = fStack_b5c;
                      }
                      if (*args.valid == 0) goto LAB_002357dd;
                    }
                    uVar96 = 0;
                    uVar52 = local_b90;
                  }
                  else {
                    (*pGVar20->occlusionFilterN)(&args);
                    auVar98._8_4_ = 0xffffffff;
                    auVar98._0_8_ = 0xffffffffffffffff;
                    auVar98._12_4_ = 0xffffffff;
                    context = local_b70;
                    ray = local_b78;
                    uVar46 = local_b98;
                    uVar47 = local_ba0;
                    uVar48 = local_ba8;
                    uVar51 = local_bb0;
                    fVar94 = local_af8;
                    fVar74 = fStack_af4;
                    fVar71 = fStack_af0;
                    fVar72 = fStack_aec;
                    fVar177 = local_b58;
                    fVar88 = fStack_b54;
                    fVar92 = fStack_b50;
                    fVar97 = fStack_b4c;
                    fVar57 = local_b08;
                    fVar107 = fStack_b04;
                    fVar109 = fStack_b00;
                    fVar114 = fStack_afc;
                    fVar112 = local_b18;
                    fVar115 = fStack_b14;
                    fVar123 = fStack_b10;
                    fVar124 = fStack_b0c;
                    fVar184 = local_b28;
                    fVar127 = fStack_b24;
                    fVar128 = fStack_b20;
                    fVar130 = fStack_b1c;
                    fVar131 = local_b38;
                    fVar134 = fStack_b34;
                    fVar139 = fStack_b30;
                    fVar142 = fStack_b2c;
                    fVar200 = local_b48;
                    fVar145 = fStack_b44;
                    fVar147 = fStack_b40;
                    fVar154 = fStack_b3c;
                    fVar181 = local_b68;
                    fVar156 = fStack_b64;
                    fVar159 = fStack_b60;
                    fVar160 = fStack_b5c;
                    if (*args.valid != 0) goto LAB_00235745;
LAB_002357dd:
                    ray->tfar = (float)local_b88._0_4_;
                    uVar54 = uVar54 ^ 1L << (uVar22 & 0x3f);
                    uVar96 = (uint)CONCAT71((int7)((ulong)args.valid >> 8),1);
                    uVar52 = local_b90;
                  }
                }
              }
              if ((char)uVar96 == '\0') goto LAB_002360a6;
              pNVar55 = local_ae0;
            } while (uVar54 != 0);
          }
        }
        local_a38 = (float)uVar12;
        fStack_a34 = (float)((ulong)uVar12 >> 0x20);
        fStack_a30 = (float)uVar35;
        fVar94 = (ray->org).field_0.m128[0];
        fVar74 = (ray->org).field_0.m128[1];
        fVar112 = (ray->org).field_0.m128[2];
        local_a38 = local_a38 - fVar94;
        fVar115 = (float)local_838 - fVar94;
        fVar123 = (float)local_858 - fVar94;
        fVar124 = (float)local_848 - fVar94;
        fStack_a34 = fStack_a34 - fVar74;
        fVar156 = local_838._4_4_ - fVar74;
        fVar160 = local_858._4_4_ - fVar74;
        fVar132 = local_848._4_4_ - fVar74;
        fStack_a30 = fStack_a30 - fVar112;
        fVar127 = (float)uStack_830 - fVar112;
        fVar128 = (float)uStack_850 - fVar112;
        fVar130 = (float)uStack_840 - fVar112;
        fVar73 = fVar73 - fVar94;
        fVar157 = fVar157 - fVar94;
        fVar76 = fVar76 - fVar94;
        fVar91 = fVar91 - fVar94;
        fVar110 = fVar110 - fVar74;
        fVar183 = fVar183 - fVar74;
        fVar87 = fVar87 - fVar74;
        fVar93 = fVar93 - fVar74;
        fVar95 = fVar95 - fVar112;
        fVar125 = fVar125 - fVar112;
        fStack_a40 = fStack_a40 - fVar112;
        fStack_a3c = fStack_a3c - fVar112;
        fVar186 = local_828 - fVar94;
        fVar187 = fStack_824 - fVar94;
        fVar191 = fStack_820 - fVar94;
        fVar94 = fStack_81c - fVar94;
        fVar173 = local_818 - fVar74;
        fVar174 = fStack_814 - fVar74;
        fVar175 = fStack_810 - fVar74;
        fVar74 = fStack_80c - fVar74;
        fVar71 = (float)local_808 - fVar112;
        fVar184 = local_808._4_4_ - fVar112;
        fVar134 = fStack_800 - fVar112;
        fVar112 = fStack_7fc - fVar112;
        fVar140 = fVar186 - local_a38;
        fVar143 = fVar187 - fVar115;
        fVar164 = fVar191 - fVar123;
        fVar165 = fVar94 - fVar124;
        fVar198 = fVar173 - fStack_a34;
        fVar199 = fVar174 - fVar156;
        fVar201 = fVar175 - fVar160;
        fVar202 = fVar74 - fVar132;
        fVar192 = fVar71 - fStack_a30;
        fVar193 = fVar184 - fVar127;
        fVar194 = fVar134 - fVar128;
        fVar197 = fVar112 - fVar130;
        fVar131 = (ray->dir).field_0.m128[0];
        fVar200 = (ray->dir).field_0.m128[1];
        fVar57 = (ray->dir).field_0.m128[2];
        fVar176 = (fVar198 * (fVar71 + fStack_a30) - fVar192 * (fVar173 + fStack_a34)) * fVar131 +
                  (fVar192 * (fVar186 + local_a38) - (fVar71 + fStack_a30) * fVar140) * fVar200 +
                  ((fVar173 + fStack_a34) * fVar140 - (fVar186 + local_a38) * fVar198) * fVar57;
        fVar178 = (fVar199 * (fVar184 + fVar127) - fVar193 * (fVar174 + fVar156)) * fVar131 +
                  (fVar193 * (fVar187 + fVar115) - (fVar184 + fVar127) * fVar143) * fVar200 +
                  ((fVar174 + fVar156) * fVar143 - (fVar187 + fVar115) * fVar199) * fVar57;
        fVar182 = (fVar201 * (fVar134 + fVar128) - fVar194 * (fVar175 + fVar160)) * fVar131 +
                  (fVar194 * (fVar191 + fVar123) - (fVar134 + fVar128) * fVar164) * fVar200 +
                  ((fVar175 + fVar160) * fVar164 - (fVar191 + fVar123) * fVar201) * fVar57;
        fVar185 = (fVar202 * (fVar112 + fVar130) - fVar197 * (fVar74 + fVar132)) * fVar131 +
                  (fVar197 * (fVar94 + fVar124) - (fVar112 + fVar130) * fVar165) * fVar200 +
                  ((fVar74 + fVar132) * fVar165 - (fVar94 + fVar124) * fVar202) * fVar57;
        fVar139 = fStack_a34 - fVar110;
        fVar142 = fVar156 - fVar183;
        fVar145 = fVar160 - fVar87;
        fVar147 = fVar132 - fVar93;
        fVar166 = fStack_a30 - fVar95;
        fVar167 = fVar127 - fVar125;
        fVar171 = fVar128 - fStack_a40;
        fVar172 = fVar130 - fStack_a3c;
        fVar154 = local_a38 - fVar73;
        fVar159 = fVar115 - fVar157;
        fVar181 = fVar123 - fVar76;
        fVar137 = fVar124 - fVar91;
        auVar151._0_4_ =
             (fVar139 * (fStack_a30 + fVar95) - fVar166 * (fStack_a34 + fVar110)) * fVar131 +
             (fVar166 * (local_a38 + fVar73) - (fStack_a30 + fVar95) * fVar154) * fVar200 +
             ((fStack_a34 + fVar110) * fVar154 - (local_a38 + fVar73) * fVar139) * fVar57;
        auVar151._4_4_ =
             (fVar142 * (fVar127 + fVar125) - fVar167 * (fVar156 + fVar183)) * fVar131 +
             (fVar167 * (fVar115 + fVar157) - (fVar127 + fVar125) * fVar159) * fVar200 +
             ((fVar156 + fVar183) * fVar159 - (fVar115 + fVar157) * fVar142) * fVar57;
        auVar151._8_4_ =
             (fVar145 * (fVar128 + fStack_a40) - fVar171 * (fVar160 + fVar87)) * fVar131 +
             (fVar171 * (fVar123 + fVar76) - (fVar128 + fStack_a40) * fVar181) * fVar200 +
             ((fVar160 + fVar87) * fVar181 - (fVar123 + fVar76) * fVar145) * fVar57;
        auVar151._12_4_ =
             (fVar147 * (fVar130 + fStack_a3c) - fVar172 * (fVar132 + fVar93)) * fVar131 +
             (fVar172 * (fVar124 + fVar91) - (fVar130 + fStack_a3c) * fVar137) * fVar200 +
             ((fVar132 + fVar93) * fVar137 - (fVar124 + fVar91) * fVar147) * fVar57;
        fVar72 = fVar73 - fVar186;
        fVar177 = fVar157 - fVar187;
        fVar88 = fVar76 - fVar191;
        fVar92 = fVar91 - fVar94;
        fVar97 = fVar110 - fVar173;
        fVar107 = fVar183 - fVar174;
        fVar109 = fVar87 - fVar175;
        fVar114 = fVar93 - fVar74;
        local_b88._0_4_ = fVar95 - fVar71;
        local_b88._4_4_ = fVar125 - fVar184;
        fStack_b80 = fStack_a40 - fVar134;
        fStack_b7c = fStack_a3c - fVar112;
        auVar67._0_4_ =
             (fVar97 * (fVar71 + fVar95) - (float)local_b88._0_4_ * (fVar173 + fVar110)) * fVar131 +
             ((float)local_b88._0_4_ * (fVar186 + fVar73) - (fVar71 + fVar95) * fVar72) * fVar200 +
             ((fVar173 + fVar110) * fVar72 - (fVar186 + fVar73) * fVar97) * fVar57;
        auVar67._4_4_ =
             (fVar107 * (fVar184 + fVar125) - (float)local_b88._4_4_ * (fVar174 + fVar183)) *
             fVar131 + ((float)local_b88._4_4_ * (fVar187 + fVar157) - (fVar184 + fVar125) * fVar177
                       ) * fVar200 +
                       ((fVar174 + fVar183) * fVar177 - (fVar187 + fVar157) * fVar107) * fVar57;
        auVar67._8_4_ =
             (fVar109 * (fVar134 + fStack_a40) - fStack_b80 * (fVar175 + fVar87)) * fVar131 +
             (fStack_b80 * (fVar191 + fVar76) - (fVar134 + fStack_a40) * fVar88) * fVar200 +
             ((fVar175 + fVar87) * fVar88 - (fVar191 + fVar76) * fVar109) * fVar57;
        auVar67._12_4_ =
             (fVar114 * (fVar112 + fStack_a3c) - fStack_b7c * (fVar74 + fVar93)) * fVar131 +
             (fStack_b7c * (fVar94 + fVar91) - (fVar112 + fStack_a3c) * fVar92) * fVar200 +
             ((fVar74 + fVar93) * fVar92 - (fVar94 + fVar91) * fVar114) * fVar57;
        fVar184 = fVar176 + auVar151._0_4_ + auVar67._0_4_;
        fVar134 = fVar178 + auVar151._4_4_ + auVar67._4_4_;
        fVar73 = fVar182 + auVar151._8_4_ + auVar67._8_4_;
        fVar110 = fVar185 + auVar151._12_4_ + auVar67._12_4_;
        auVar79._8_4_ = fVar182;
        auVar79._0_8_ = CONCAT44(fVar178,fVar176);
        auVar79._12_4_ = fVar185;
        auVar58 = minps(auVar79,auVar151);
        auVar58 = minps(auVar58,auVar67);
        auVar120._8_4_ = fVar182;
        auVar120._0_8_ = CONCAT44(fVar178,fVar176);
        auVar120._12_4_ = fVar185;
        auVar98 = maxps(auVar120,auVar151);
        auVar98 = maxps(auVar98,auVar67);
        fVar94 = ABS(fVar184) * 1.1920929e-07;
        fVar74 = ABS(fVar134) * 1.1920929e-07;
        fVar112 = ABS(fVar73) * 1.1920929e-07;
        fVar71 = ABS(fVar110) * 1.1920929e-07;
        auVar121._4_4_ = -(uint)(auVar98._4_4_ <= fVar74);
        auVar121._0_4_ = -(uint)(auVar98._0_4_ <= fVar94);
        auVar121._8_4_ = -(uint)(auVar98._8_4_ <= fVar112);
        auVar121._12_4_ = -(uint)(auVar98._12_4_ <= fVar71);
        auVar80._4_4_ = -(uint)(-fVar74 <= auVar58._4_4_);
        auVar80._0_4_ = -(uint)(-fVar94 <= auVar58._0_4_);
        auVar80._8_4_ = -(uint)(-fVar112 <= auVar58._8_4_);
        auVar80._12_4_ = -(uint)(-fVar71 <= auVar58._12_4_);
        auVar121 = auVar121 | auVar80;
        iVar50 = movmskps(uVar96,auVar121);
        if (iVar50 != 0) {
          auVar152._0_4_ = fVar198 * fVar166 - fVar192 * fVar139;
          auVar152._4_4_ = fVar199 * fVar167 - fVar193 * fVar142;
          auVar152._8_4_ = fVar201 * fVar171 - fVar194 * fVar145;
          auVar152._12_4_ = fVar202 * fVar172 - fVar197 * fVar147;
          auVar207._0_4_ = fVar139 * (float)local_b88._0_4_ - fVar166 * fVar97;
          auVar207._4_4_ = fVar142 * (float)local_b88._4_4_ - fVar167 * fVar107;
          auVar207._8_4_ = fVar145 * fStack_b80 - fVar171 * fVar109;
          auVar207._12_4_ = fVar147 * fStack_b7c - fVar172 * fVar114;
          auVar68._4_4_ = -(uint)(ABS(fVar193 * fVar142) < ABS(fVar167 * fVar107));
          auVar68._0_4_ = -(uint)(ABS(fVar192 * fVar139) < ABS(fVar166 * fVar97));
          auVar68._8_4_ = -(uint)(ABS(fVar194 * fVar145) < ABS(fVar171 * fVar109));
          auVar68._12_4_ = -(uint)(ABS(fVar197 * fVar147) < ABS(fVar172 * fVar114));
          fVar95 = (float)DAT_01feca10;
          fVar157 = DAT_01feca10._4_4_;
          fVar183 = DAT_01feca10._12_4_;
          local_8a8 = blendvps(auVar207,auVar152,auVar68);
          auVar136._0_4_ = fVar192 * fVar154 - fVar140 * fVar166;
          auVar136._4_4_ = fVar193 * fVar159 - fVar143 * fVar167;
          auVar136._8_4_ = fVar194 * fVar181 - fVar164 * fVar171;
          auVar136._12_4_ = fVar197 * fVar137 - fVar165 * fVar172;
          auVar217._0_4_ = fVar166 * fVar72 - fVar154 * (float)local_b88._0_4_;
          auVar217._4_4_ = fVar167 * fVar177 - fVar159 * (float)local_b88._4_4_;
          auVar217._8_4_ = fVar171 * fVar88 - fVar181 * fStack_b80;
          auVar217._12_4_ = fVar172 * fVar92 - fVar137 * fStack_b7c;
          auVar69._4_4_ = -(uint)(ABS(fVar143 * fVar167) < ABS(fVar159 * (float)local_b88._4_4_));
          auVar69._0_4_ = -(uint)(ABS(fVar140 * fVar166) < ABS(fVar154 * (float)local_b88._0_4_));
          auVar69._8_4_ = -(uint)(ABS(fVar164 * fVar171) < ABS(fVar181 * fStack_b80));
          auVar69._12_4_ = -(uint)(ABS(fVar165 * fVar172) < ABS(fVar137 * fStack_b7c));
          local_898 = blendvps(auVar217,auVar136,auVar69);
          auVar180._0_4_ = fVar140 * fVar139 - fVar198 * fVar154;
          auVar180._4_4_ = fVar143 * fVar142 - fVar199 * fVar159;
          auVar180._8_4_ = fVar164 * fVar145 - fVar201 * fVar181;
          auVar180._12_4_ = fVar165 * fVar147 - fVar202 * fVar137;
          auVar163._0_4_ = fVar154 * fVar97 - fVar139 * fVar72;
          auVar163._4_4_ = fVar159 * fVar107 - fVar142 * fVar177;
          auVar163._8_4_ = fVar181 * fVar109 - fVar145 * fVar88;
          auVar163._12_4_ = fVar137 * fVar114 - fVar147 * fVar92;
          auVar70._4_4_ = -(uint)(ABS(fVar199 * fVar159) < ABS(fVar142 * fVar177));
          auVar70._0_4_ = -(uint)(ABS(fVar198 * fVar154) < ABS(fVar139 * fVar72));
          auVar70._8_4_ = -(uint)(ABS(fVar201 * fVar181) < ABS(fVar145 * fVar88));
          auVar70._12_4_ = -(uint)(ABS(fVar202 * fVar137) < ABS(fVar147 * fVar92));
          local_888 = blendvps(auVar163,auVar180,auVar70);
          fVar94 = fVar131 * local_8a8._0_4_ + fVar200 * local_898._0_4_ + fVar57 * local_888._0_4_;
          fVar74 = fVar131 * local_8a8._4_4_ + fVar200 * local_898._4_4_ + fVar57 * local_888._4_4_;
          fVar112 = fVar131 * local_8a8._8_4_ + fVar200 * local_898._8_4_ + fVar57 * local_888._8_4_
          ;
          fVar131 = fVar131 * local_8a8._12_4_ +
                    fVar200 * local_898._12_4_ + fVar57 * local_888._12_4_;
          auVar169._0_4_ = fVar94 + fVar94;
          auVar169._4_4_ = fVar74 + fVar74;
          auVar169._8_4_ = fVar112 + fVar112;
          auVar169._12_4_ = fVar131 + fVar131;
          auVar81._0_4_ = fStack_a30 * local_888._0_4_;
          auVar81._4_4_ = fVar127 * local_888._4_4_;
          auVar81._8_4_ = fVar128 * local_888._8_4_;
          auVar81._12_4_ = fVar130 * local_888._12_4_;
          fVar57 = local_a38 * local_8a8._0_4_ + fStack_a34 * local_898._0_4_ + auVar81._0_4_;
          fVar71 = fVar115 * local_8a8._4_4_ + fVar156 * local_898._4_4_ + auVar81._4_4_;
          fVar72 = fVar123 * local_8a8._8_4_ + fVar160 * local_898._8_4_ + auVar81._8_4_;
          fVar177 = fVar124 * local_8a8._12_4_ + fVar132 * local_898._12_4_ + auVar81._12_4_;
          auVar58 = rcpps(auVar81,auVar169);
          fVar94 = auVar58._0_4_;
          fVar74 = auVar58._4_4_;
          fVar131 = auVar58._8_4_;
          fVar200 = auVar58._12_4_;
          fVar112 = DAT_01feca10._8_4_;
          local_8b8._0_4_ =
               ((fVar95 - auVar169._0_4_ * fVar94) * fVar94 + fVar94) * (fVar57 + fVar57);
          local_8b8._4_4_ =
               ((fVar157 - auVar169._4_4_ * fVar74) * fVar74 + fVar74) * (fVar71 + fVar71);
          fStack_8b0 = ((fVar112 - auVar169._8_4_ * fVar131) * fVar131 + fVar131) *
                       (fVar72 + fVar72);
          fStack_8ac = ((fVar183 - auVar169._12_4_ * fVar200) * fVar200 + fVar200) *
                       (fVar177 + fVar177);
          fVar94 = ray->tfar;
          fVar74 = (ray->org).field_0.m128[3];
          auVar104._0_4_ =
               -(uint)((float)local_8b8._0_4_ <= fVar94 && fVar74 <= (float)local_8b8._0_4_);
          auVar104._4_4_ =
               -(uint)((float)local_8b8._4_4_ <= fVar94 && fVar74 <= (float)local_8b8._4_4_);
          auVar104._8_4_ = -(uint)(fStack_8b0 <= fVar94 && fVar74 <= fStack_8b0);
          auVar104._12_4_ = -(uint)(fStack_8ac <= fVar94 && fVar74 <= fStack_8ac);
          auVar170._0_4_ = -(uint)(auVar169._0_4_ != 0.0) & auVar121._0_4_ & auVar104._0_4_;
          auVar170._4_4_ = -(uint)(auVar169._4_4_ != 0.0) & auVar121._4_4_ & auVar104._4_4_;
          auVar170._8_4_ = -(uint)(auVar169._8_4_ != 0.0) & auVar121._8_4_ & auVar104._8_4_;
          auVar170._12_4_ = -(uint)(auVar169._12_4_ != 0.0) & auVar121._12_4_ & auVar104._12_4_;
          uVar96 = movmskps(iVar50,auVar170);
          if (uVar96 != 0) {
            auVar37._4_4_ = fVar134;
            auVar37._0_4_ = fVar184;
            auVar37._8_4_ = fVar73;
            auVar37._12_4_ = fVar110;
            local_878 = local_868;
            auVar58 = rcpps(auVar104,auVar37);
            fVar94 = auVar58._0_4_;
            fVar74 = auVar58._4_4_;
            fVar131 = auVar58._8_4_;
            fVar200 = auVar58._12_4_;
            fVar94 = (float)(-(uint)(1e-18 <= ABS(fVar184)) &
                            (uint)((fVar95 - fVar184 * fVar94) * fVar94 + fVar94));
            fVar74 = (float)(-(uint)(1e-18 <= ABS(fVar134)) &
                            (uint)((fVar157 - fVar134 * fVar74) * fVar74 + fVar74));
            fVar131 = (float)(-(uint)(1e-18 <= ABS(fVar73)) &
                             (uint)((fVar112 - fVar73 * fVar131) * fVar131 + fVar131));
            fVar200 = (float)(-(uint)(1e-18 <= ABS(fVar110)) &
                             (uint)((fVar183 - fVar110 * fVar200) * fVar200 + fVar200));
            auVar196._0_4_ = fVar176 * fVar94;
            auVar196._4_4_ = fVar178 * fVar74;
            auVar196._8_4_ = fVar182 * fVar131;
            auVar196._12_4_ = fVar185 * fVar200;
            auVar98 = minps(auVar196,_DAT_01feca10);
            auVar190._0_4_ = fVar94 * auVar151._0_4_;
            auVar190._4_4_ = fVar74 * auVar151._4_4_;
            auVar190._8_4_ = fVar131 * auVar151._8_4_;
            auVar190._12_4_ = fVar200 * auVar151._12_4_;
            auVar58 = minps(auVar190,_DAT_01feca10);
            auVar82._0_4_ = fVar95 - auVar98._0_4_;
            auVar82._4_4_ = fVar157 - auVar98._4_4_;
            auVar82._8_4_ = fVar112 - auVar98._8_4_;
            auVar82._12_4_ = fVar183 - auVar98._12_4_;
            auVar105._0_4_ = fVar95 - auVar58._0_4_;
            auVar105._4_4_ = fVar157 - auVar58._4_4_;
            auVar105._8_4_ = fVar112 - auVar58._8_4_;
            auVar105._12_4_ = fVar183 - auVar58._12_4_;
            local_8d8 = blendvps(auVar98,auVar82,local_868);
            local_8c8 = blendvps(auVar58,auVar105,local_868);
            uVar54 = (ulong)(uVar96 & 0xff);
            auVar98._8_4_ = 0xffffffff;
            auVar98._0_8_ = 0xffffffffffffffff;
            auVar98._12_4_ = 0xffffffff;
            fVar94 = local_af8;
            fVar74 = fStack_af4;
            fVar71 = fStack_af0;
            fVar72 = fStack_aec;
            fVar177 = local_b58;
            fVar88 = fStack_b54;
            fVar92 = fStack_b50;
            fVar97 = fStack_b4c;
            fVar57 = local_b08;
            fVar107 = fStack_b04;
            fVar109 = fStack_b00;
            fVar114 = fStack_afc;
            fVar112 = local_b18;
            fVar115 = fStack_b14;
            fVar123 = fStack_b10;
            fVar124 = fStack_b0c;
            fVar184 = local_b28;
            fVar127 = fStack_b24;
            fVar128 = fStack_b20;
            fVar130 = fStack_b1c;
            fVar131 = local_b38;
            fVar134 = fStack_b34;
            fVar139 = fStack_b30;
            fVar142 = fStack_b2c;
            fVar200 = local_b48;
            fVar145 = fStack_b44;
            fVar147 = fStack_b40;
            fVar154 = fStack_b3c;
            fVar181 = local_b68;
            fVar156 = fStack_b64;
            fVar159 = fStack_b60;
            fVar160 = fStack_b5c;
            do {
              uVar22 = 0;
              if (uVar54 != 0) {
                for (; (uVar54 >> uVar22 & 1) == 0; uVar22 = uVar22 + 1) {
                }
              }
              h.geomID = puVar49[uVar22];
              pGVar20 = (pSVar14->geometries).items[h.geomID].ptr;
              if ((pGVar20->mask & ray->mask) == 0) {
                uVar54 = uVar54 ^ 1L << (uVar22 & 0x3f);
                bVar38 = true;
              }
              else {
                pRVar21 = context->args;
                if ((pRVar21->filter == (RTCFilterFunctionN)0x0) &&
                   (pGVar20->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
                  bVar38 = false;
                  uVar52 = local_b90;
                }
                else {
                  h.u = *(float *)(local_8d8 + uVar22 * 4);
                  h.v = *(float *)(local_8c8 + uVar22 * 4);
                  args.context = context->user;
                  h.primID = *(uint *)(lVar44 + 0x50 + uVar22 * 4);
                  h.Ng.field_0.field_0.x = (float)*(undefined4 *)(local_8a8 + uVar22 * 4);
                  h.Ng.field_0.field_0.y = (float)*(undefined4 *)(local_898 + uVar22 * 4);
                  h.Ng.field_0.field_0.z = (float)*(undefined4 *)(local_888 + uVar22 * 4);
                  h.instID[0] = (args.context)->instID[0];
                  h.instPrimID[0] = (args.context)->instPrimID[0];
                  local_b88._0_4_ = ray->tfar;
                  ray->tfar = *(float *)(local_8b8 + uVar22 * 4);
                  local_bb4 = -1;
                  args.valid = &local_bb4;
                  args.geometryUserPtr = pGVar20->userPtr;
                  args.hit = (RTCHitN *)&h;
                  args.N = 1;
                  args.ray = (RTCRayN *)ray;
                  if (pGVar20->occlusionFilterN == (RTCFilterFunctionN)0x0) {
LAB_00235f6c:
                    if (pRVar21->filter != (RTCFilterFunctionN)0x0) {
                      if (((pRVar21->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                         (((pGVar20->field_8).field_0x2 & 0x40) != 0)) {
                        (*pRVar21->filter)(&args);
                        auVar98._8_4_ = 0xffffffff;
                        auVar98._0_8_ = 0xffffffffffffffff;
                        auVar98._12_4_ = 0xffffffff;
                        context = local_b70;
                        ray = local_b78;
                        uVar46 = local_b98;
                        uVar47 = local_ba0;
                        uVar48 = local_ba8;
                        uVar51 = local_bb0;
                        fVar94 = local_af8;
                        fVar74 = fStack_af4;
                        fVar71 = fStack_af0;
                        fVar72 = fStack_aec;
                        fVar177 = local_b58;
                        fVar88 = fStack_b54;
                        fVar92 = fStack_b50;
                        fVar97 = fStack_b4c;
                        fVar57 = local_b08;
                        fVar107 = fStack_b04;
                        fVar109 = fStack_b00;
                        fVar114 = fStack_afc;
                        fVar112 = local_b18;
                        fVar115 = fStack_b14;
                        fVar123 = fStack_b10;
                        fVar124 = fStack_b0c;
                        fVar184 = local_b28;
                        fVar127 = fStack_b24;
                        fVar128 = fStack_b20;
                        fVar130 = fStack_b1c;
                        fVar131 = local_b38;
                        fVar134 = fStack_b34;
                        fVar139 = fStack_b30;
                        fVar142 = fStack_b2c;
                        fVar200 = local_b48;
                        fVar145 = fStack_b44;
                        fVar147 = fStack_b40;
                        fVar154 = fStack_b3c;
                        fVar181 = local_b68;
                        fVar156 = fStack_b64;
                        fVar159 = fStack_b60;
                        fVar160 = fStack_b5c;
                      }
                      if (*args.valid == 0) goto LAB_00236004;
                    }
                    bVar38 = false;
                    uVar52 = local_b90;
                  }
                  else {
                    (*pGVar20->occlusionFilterN)(&args);
                    auVar98._8_4_ = 0xffffffff;
                    auVar98._0_8_ = 0xffffffffffffffff;
                    auVar98._12_4_ = 0xffffffff;
                    context = local_b70;
                    ray = local_b78;
                    uVar46 = local_b98;
                    uVar47 = local_ba0;
                    uVar48 = local_ba8;
                    uVar51 = local_bb0;
                    fVar94 = local_af8;
                    fVar74 = fStack_af4;
                    fVar71 = fStack_af0;
                    fVar72 = fStack_aec;
                    fVar177 = local_b58;
                    fVar88 = fStack_b54;
                    fVar92 = fStack_b50;
                    fVar97 = fStack_b4c;
                    fVar57 = local_b08;
                    fVar107 = fStack_b04;
                    fVar109 = fStack_b00;
                    fVar114 = fStack_afc;
                    fVar112 = local_b18;
                    fVar115 = fStack_b14;
                    fVar123 = fStack_b10;
                    fVar124 = fStack_b0c;
                    fVar184 = local_b28;
                    fVar127 = fStack_b24;
                    fVar128 = fStack_b20;
                    fVar130 = fStack_b1c;
                    fVar131 = local_b38;
                    fVar134 = fStack_b34;
                    fVar139 = fStack_b30;
                    fVar142 = fStack_b2c;
                    fVar200 = local_b48;
                    fVar145 = fStack_b44;
                    fVar147 = fStack_b40;
                    fVar154 = fStack_b3c;
                    fVar181 = local_b68;
                    fVar156 = fStack_b64;
                    fVar159 = fStack_b60;
                    fVar160 = fStack_b5c;
                    if (*args.valid != 0) goto LAB_00235f6c;
LAB_00236004:
                    ray->tfar = (float)local_b88._0_4_;
                    uVar54 = uVar54 ^ 1L << (uVar22 & 0x3f);
                    bVar38 = true;
                    uVar52 = local_b90;
                  }
                }
              }
              if (!bVar38) goto LAB_002360a6;
              pNVar55 = local_ae0;
            } while (uVar54 != 0);
          }
        }
        iVar50 = 0;
        uVar41 = uVar41 + 1;
        bVar56 = uVar41 < uVar45;
      } while (uVar41 != uVar45);
      auVar98._8_4_ = 0xffffffff;
      auVar98._0_8_ = 0xffffffffffffffff;
      auVar98._12_4_ = 0xffffffff;
      uVar46 = local_b98;
      uVar47 = local_ba0;
      uVar48 = local_ba8;
      uVar51 = local_bb0;
      local_ae0 = pNVar55;
      fVar94 = local_af8;
      fVar74 = fStack_af4;
      fVar71 = fStack_af0;
      fVar72 = fStack_aec;
      fVar177 = local_b58;
      fVar88 = fStack_b54;
      fVar92 = fStack_b50;
      fVar97 = fStack_b4c;
      fVar57 = local_b08;
      fVar107 = fStack_b04;
      fVar109 = fStack_b00;
      fVar114 = fStack_afc;
      fVar112 = local_b18;
      fVar115 = fStack_b14;
      fVar123 = fStack_b10;
      fVar124 = fStack_b0c;
      fVar184 = local_b28;
      fVar127 = fStack_b24;
      fVar128 = fStack_b20;
      fVar130 = fStack_b1c;
      fVar131 = local_b38;
      fVar134 = fStack_b34;
      fVar139 = fStack_b30;
      fVar142 = fStack_b2c;
      fVar200 = local_b48;
      fVar145 = fStack_b44;
      fVar147 = fStack_b40;
      fVar154 = fStack_b3c;
      fVar181 = local_b68;
      fVar156 = fStack_b64;
      fVar159 = fStack_b60;
      fVar160 = fStack_b5c;
    }
  }
  goto LAB_002360bf;
LAB_002360a6:
  iVar50 = 0;
  if (bVar56) {
    ray->tfar = -INFINITY;
    iVar50 = 3;
  }
LAB_002360bf:
  if (iVar50 == 3) {
    return;
  }
  goto LAB_00234c3a;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::occluded(const Accel::Intersectors* __restrict__ This,
                                                                             Ray& __restrict__ ray,
                                                                             RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
       
      /* early out for already occluded rays */
      if (unlikely(ray.tfar < 0.0f))
        return;

      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      NodeRef stack[stackSize];    // stack of nodes that still need to get traversed
      NodeRef* stackPtr = stack+1; // current stack pointer
      NodeRef* stackEnd = stack+stackSize;
      stack[0] = bvh->root;

      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif

      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = (NodeRef)*stackPtr;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(shadow.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(shadow.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        if (PrimitiveIntersector1::occluded(This, pre, ray, context, prim, num, tray, lazy_node)) {
          ray.tfar = neg_inf;
          break;
        }

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          *stackPtr = (NodeRef)lazy_node;
          stackPtr++;
        }
      }
    }